

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

int yylex_SKIP_TO_ENDR(void)

{
  bool bVar1;
  int iVar2;
  int local_18;
  char local_14;
  int c_1;
  int c;
  bool atLineStart;
  int depth;
  
  lexer_SetMode(LEXER_NORMAL);
  c = 1;
  c_1._3_1_ = lexerState->atLineStart & 1;
  lexerState->disableMacroArgs = true;
  lexerState->disableInterpolation = true;
  do {
    if (c_1._3_1_ != 0) {
      while( true ) {
        iVar2 = peek();
        bVar1 = isWhitespace(iVar2);
        if (!bVar1) break;
        shiftChar();
      }
      bVar1 = startsIdentifier(iVar2);
      if (bVar1) {
        shiftChar();
        local_14 = (char)iVar2;
        iVar2 = readIdentifier(local_14);
        switch(iVar2) {
        case 0x5d:
          lexer_IncIFDepth();
          break;
        case 0x60:
          lexer_DecIFDepth();
          break;
        case 0x73:
        case 0x74:
          c = c + 1;
          break;
        case 0x7b:
          c = c + -1;
          if (c == 0) {
LAB_00110fc7:
            lexerState->disableMacroArgs = false;
            lexerState->disableInterpolation = false;
            lexerState->atLineStart = false;
            return 0;
          }
        }
      }
      c_1._3_1_ = 0;
    }
    do {
      local_18 = nextChar();
      if (local_18 == -1) goto LAB_00110fc7;
      if (local_18 == 0x5c) {
        local_18 = nextChar();
      }
      else if ((local_18 == 0xd) || (local_18 == 10)) {
        c_1._3_1_ = 1;
      }
      if ((local_18 == 0xd) || (local_18 == 10)) {
        handleCRLF(local_18);
        nextLine();
      }
    } while (((c_1._3_1_ ^ 0xff) & 1) != 0);
  } while( true );
}

Assistant:

static int yylex_SKIP_TO_ENDR(void)
{
	lexer_SetMode(LEXER_NORMAL);
	int depth = 1;
	bool atLineStart = lexerState->atLineStart;

	// Prevent expanding macro args and symbol interpolation in this state
	lexerState->disableMacroArgs = true;
	lexerState->disableInterpolation = true;

	for (;;) {
		if (atLineStart) {
			int c;

			for (;;) {
				c = peek();
				if (!isWhitespace(c))
					break;
				shiftChar();
			}

			if (startsIdentifier(c)) {
				shiftChar();
				switch (readIdentifier(c)) {
				case T_POP_FOR:
				case T_POP_REPT:
					depth++;
					break;

				case T_POP_ENDR:
					depth--;
					if (!depth)
						goto finish;
					break;

				case T_POP_IF:
					lexer_IncIFDepth();
					break;

				case T_POP_ENDC:
					lexer_DecIFDepth();
				}
			}
			atLineStart = false;
		}

		// Read chars until EOL
		do {
			int c = nextChar();

			if (c == EOF) {
				goto finish;
			} else if (c == '\\') {
				// Unconditionally skip the next char, including line conts
				c = nextChar();
			} else if (c == '\r' || c == '\n') {
				atLineStart = true;
			}

			if (c == '\r' || c == '\n') {
				// Handle CRLF before nextLine() since shiftChar updates colNo
				handleCRLF(c);
				// Do this both on line continuations and plain EOLs
				nextLine();
			}
		} while (!atLineStart);
	}

finish:
	lexerState->disableMacroArgs = false;
	lexerState->disableInterpolation = false;
	lexerState->atLineStart = false;

	// yywrap() will finish the REPT/FOR loop
	return T_EOF;
}